

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O2

void __thiscall XmlRpc::XmlRpcValue::assertTypeOrInvalid(XmlRpcValue *this,Type t)

{
  pointer *ppcVar1;
  string *this_00;
  BinaryData *pBVar2;
  allocator<char> local_39;
  string local_38 [32];
  
  if (this->_type == TypeInvalid) {
    this->_type = t;
    switch(t) {
    case TypeString:
      pBVar2 = (BinaryData *)operator_new(0x20);
      (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&(pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      *(undefined1 *)
       &(pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = 0;
      break;
    case TypeDateTime:
      pBVar2 = (BinaryData *)operator_new(0x38);
      (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pBVar2[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      pBVar2[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      pBVar2[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pBVar2[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      break;
    case TypeBase64:
    case TypeArray:
      pBVar2 = (BinaryData *)operator_new(0x18);
      (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      break;
    case TypeStruct:
      pBVar2 = (BinaryData *)operator_new(0x30);
      ppcVar1 = &(pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pBVar2[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      pBVar2[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppcVar1;
      pBVar2[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)ppcVar1;
      pBVar2[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      break;
    default:
      (this->_value).asDouble = 0.0;
      return;
    }
    (this->_value).asBinary = pBVar2;
  }
  else if (this->_type != t) {
    this_00 = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>(local_38,"type error",&local_39);
    std::__cxx11::string::string(this_00,local_38);
    *(undefined4 *)(this_00 + 0x20) = 0xffffffff;
    __cxa_throw(this_00,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
  }
  return;
}

Assistant:

void XmlRpcValue::assertTypeOrInvalid(Type t)
  {
    if (_type == TypeInvalid)
    {
      _type = t;
      switch (_type) {    // Ensure there is a valid value for the type
        case TypeString:   _value.asString = new std::string(); break;
        case TypeDateTime: _value.asTime = new struct tm();     break;
        case TypeBase64:   _value.asBinary = new BinaryData();  break;
        case TypeArray:    _value.asArray = new ValueArray();   break;
        case TypeStruct:   _value.asStruct = new ValueStruct(); break;
        default:           _value.asBinary = 0; break;
      }
    }
    else if (_type != t)
      throw XmlRpcException("type error");
  }